

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_FindMatchingFont(uchar *fontdata,char *name,int flags)

{
  stbtt_int32 next_id;
  uint fontstart;
  int iVar1;
  stbtt_uint32 sVar2;
  size_t sVar3;
  stbtt_int32 i;
  int index;
  stbtt_int32 nlen;
  undefined8 local_38;
  
  local_38 = CONCAT44(flags,flags) & 0x7ffffffff;
  index = 0;
  do {
    fontstart = stbtt_GetFontOffsetForIndex(fontdata,index);
    if ((int)fontstart < 0) {
      return fontstart;
    }
    sVar3 = strlen(name);
    iVar1 = stbtt__isfont(fontdata + fontstart);
    if (iVar1 != 0) {
      if ((int)local_38 != 0) {
        sVar2 = stbtt__find_table(fontdata,fontstart,"head");
        if (local_38._4_4_ != (fontdata[(ulong)sVar2 + 0x2d] & 7)) goto LAB_00164a47;
      }
      sVar2 = stbtt__find_table(fontdata,fontstart,"name");
      if (sVar2 != 0) {
        nlen = (stbtt_int32)sVar3;
        if ((int)local_38 == 0) {
          iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen,0x10,0x11);
          if (iVar1 != 0) {
            return fontstart;
          }
          next_id = 2;
        }
        else {
          iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen,0x10,-1);
          if (iVar1 != 0) {
            return fontstart;
          }
          next_id = -1;
        }
        iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen,1,next_id);
        if (iVar1 != 0) {
          return fontstart;
        }
        iVar1 = stbtt__matchpair(fontdata,sVar2,(stbtt_uint8 *)name,nlen,3,-1);
        if (iVar1 != 0) {
          return fontstart;
        }
      }
    }
LAB_00164a47:
    index = index + 1;
  } while( true );
}

Assistant:

STBTT_DEF int stbtt_FindMatchingFont(const unsigned char *fontdata, const char *name, int flags)
{
   return stbtt_FindMatchingFont_internal((unsigned char *) fontdata, (char *) name, flags);
}